

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O0

void cmime_header_set_name(CMimeHeader_T *header,char *name)

{
  char *pcVar1;
  char *name_local;
  CMimeHeader_T *header_local;
  
  if (header == (CMimeHeader_T *)0x0) {
    __assert_fail("header",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                  ,0x38,"void cmime_header_set_name(CMimeHeader_T *, const char *)");
  }
  if (name != (char *)0x0) {
    if (header->name != (char *)0x0) {
      free(header->name);
    }
    pcVar1 = strdup(name);
    header->name = pcVar1;
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x39,"void cmime_header_set_name(CMimeHeader_T *, const char *)");
}

Assistant:

void cmime_header_set_name(CMimeHeader_T *header, const char *name) {
    assert(header);
    assert(name);
    
    if (header->name != NULL) 
        free(header->name);
    
    header->name = strdup(name);
}